

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

Expected<const_llvm::DWARFDebugLine::LineTable_*> __thiscall
llvm::DWARFDebugLine::getOrParseLineTable
          (DWARFDebugLine *this,DWARFDataExtractor *DebugLineData,uint64_t Offset,DWARFContext *Ctx,
          DWARFUnit *U,function<void_(llvm::Error)> *RecoverableErrorCallback)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  pointer puVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer pFVar6;
  pointer pFVar7;
  pointer pRVar8;
  pointer pRVar9;
  pointer pSVar10;
  pointer pSVar11;
  char *Fmt;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong uVar12;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  _Base_ptr *DebugLineData_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>,_bool>
  pVar13;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> EVar14;
  error_code EC;
  function<void_(llvm::Error)> *in_stack_00000008;
  LineTable local_1c8;
  undefined1 local_120 [8];
  Error Err;
  undefined1 local_70 [40];
  Error local_48;
  Error local_40;
  undefined1 local_38 [8];
  uint64_t Offset_local;
  
  local_38 = (undefined1  [8])Ctx;
  if (Ctx < *(DWARFContext **)(Offset + 8)) {
    local_70._32_8_ = RecoverableErrorCallback;
    LineTable::LineTable(&local_1c8);
    pSVar11 = local_1c8.Sequences.
              super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pSVar10 = local_1c8.Sequences.
              super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar9 = local_1c8.Rows.
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pRVar8 = local_1c8.Rows.
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar7 = local_1c8.Prologue.FileNames.
             super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pFVar6 = local_1c8.Prologue.FileNames.
             super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar5 = local_1c8.Prologue.IncludeDirectories.
             super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    pDVar4 = local_1c8.Prologue.IncludeDirectories.
             super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar3 = local_1c8.Prologue.StandardOpcodeLengths.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar2 = local_1c8.Prologue.StandardOpcodeLengths.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_120 = local_38;
    Err.Payload._0_4_ = local_1c8.UnknownRowIndex;
    local_1c8.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Prologue.StandardOpcodeLengths.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Prologue.IncludeDirectories.
    super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Prologue.FileNames.
    super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Rows.
    super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.Sequences.
    super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVar13 = std::
             _Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>>
             ::_M_insert_unique<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>
                       ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>>
                         *)DebugLineData,
                        (pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable> *)local_120);
    uVar12 = pVar13._8_8_;
    if (pSVar10 != (pointer)0x0) {
      operator_delete(pSVar10,(long)pSVar11 - (long)pSVar10);
      uVar12 = extraout_RDX;
    }
    if (pRVar8 != (pointer)0x0) {
      operator_delete(pRVar8,(long)pRVar9 - (long)pRVar8);
      uVar12 = extraout_RDX_00;
    }
    if (pFVar6 != (pointer)0x0) {
      operator_delete(pFVar6,(long)pFVar7 - (long)pFVar6);
      uVar12 = extraout_RDX_01;
    }
    if (pDVar4 != (pointer)0x0) {
      operator_delete(pDVar4,(long)pDVar5 - (long)pDVar4);
      uVar12 = extraout_RDX_02;
    }
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
      uVar12 = extraout_RDX_03;
    }
    if (local_1c8.Sequences.
        super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Sequences.
                      super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Sequences.
                            super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Sequences.
                            super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar12 = extraout_RDX_04;
    }
    if (local_1c8.Rows.
        super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Rows.
                      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Rows.
                            super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Rows.
                            super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar12 = extraout_RDX_05;
    }
    if (local_1c8.Prologue.FileNames.
        super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Prologue.FileNames.
                      super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Prologue.FileNames.
                            super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Prologue.FileNames.
                            super__Vector_base<llvm::DWARFDebugLine::FileNameEntry,_std::allocator<llvm::DWARFDebugLine::FileNameEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar12 = extraout_RDX_06;
    }
    if (local_1c8.Prologue.IncludeDirectories.
        super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Prologue.IncludeDirectories.
                      super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.Prologue.IncludeDirectories.
                            super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Prologue.IncludeDirectories.
                            super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      uVar12 = extraout_RDX_07;
    }
    if (local_1c8.Prologue.StandardOpcodeLengths.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.Prologue.StandardOpcodeLengths.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.Prologue.StandardOpcodeLengths.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.Prologue.StandardOpcodeLengths.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      uVar12 = extraout_RDX_08;
    }
    DebugLineData_00 = &pVar13.first._M_node._M_node[1]._M_parent;
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::function<void_(llvm::Error)>::function
                ((function<void_(llvm::Error)> *)local_70,in_stack_00000008);
      LineTable::parse((LineTable *)local_120,(DWARFDataExtractor *)DebugLineData_00,
                       (uint64_t *)Offset,(DWARFContext *)local_38,U,
                       (function<void_(llvm::Error)> *)local_70._32_8_,(raw_ostream *)local_70);
      if ((code *)local_70._16_8_ != (code *)0x0) {
        (*(code *)local_70._16_8_)(local_70,local_70,3);
      }
      uVar12 = (ulong)local_120 & 0xfffffffffffffffe;
      if (uVar12 != 0) {
        local_40.Payload = (ErrorInfoBase *)((ulong)local_120 | 1);
        local_120 = (undefined1  [8])0x0;
        Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
                  ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_40);
        uVar12 = extraout_RDX_09;
        local_48.Payload = (ErrorInfoBase *)local_120;
        if ((long *)((ulong)local_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_40.Payload & 0xfffffffffffffffe) + 8))();
          uVar12 = extraout_RDX_10;
          local_48.Payload = (ErrorInfoBase *)local_120;
        }
        goto LAB_00aff8f6;
      }
    }
    p_Var1 = &(this->LineTableMap)._M_t._M_impl.super__Rb_tree_header;
    *(undefined1 *)&(p_Var1->_M_header)._M_color = (char)(p_Var1->_M_header)._M_color & 0xfe;
    *(_Base_ptr **)&(this->LineTableMap)._M_t._M_impl = DebugLineData_00;
  }
  else {
    Fmt = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = &local_48;
    createStringError<unsigned_long>
              (EC,Fmt,(unsigned_long *)"offset 0x%8.8lx is not a valid debug line section offset");
    Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
              ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_48);
    uVar12 = extraout_RDX_11;
LAB_00aff8f6:
    if ((long *)((ulong)local_48.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_48.Payload & 0xfffffffffffffffe) + 8))();
      uVar12 = extraout_RDX_12;
    }
  }
  EVar14._8_8_ = uVar12;
  EVar14.field_0 =
       (anon_union_8_2_427f0595_for_Expected<const_llvm::DWARFDebugLine::LineTable_*>_2)this;
  return EVar14;
}

Assistant:

Expected<const DWARFDebugLine::LineTable *> DWARFDebugLine::getOrParseLineTable(
    DWARFDataExtractor &DebugLineData, uint64_t Offset, const DWARFContext &Ctx,
    const DWARFUnit *U, std::function<void(Error)> RecoverableErrorCallback) {
  if (!DebugLineData.isValidOffset(Offset))
    return createStringError(errc::invalid_argument, "offset 0x%8.8" PRIx64
                       " is not a valid debug line section offset",
                       Offset);

  std::pair<LineTableIter, bool> Pos =
      LineTableMap.insert(LineTableMapTy::value_type(Offset, LineTable()));
  LineTable *LT = &Pos.first->second;
  if (Pos.second) {
    if (Error Err =
            LT->parse(DebugLineData, &Offset, Ctx, U, RecoverableErrorCallback))
      return std::move(Err);
    return LT;
  }
  return LT;
}